

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,char *fileName,int numThreads)

{
  ContextInitializer local_78;
  
  local_78._prov_stream = (IStream *)0x0;
  local_78._initializer.size = 0x68;
  local_78._initializer.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_78._initializer.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_78._initializer.free_fn = (exr_memory_free_func_t)0x0;
  local_78._initializer.user_data = (void *)0x0;
  local_78._initializer.read_fn = (exr_read_func_ptr_t)0x0;
  local_78._initializer.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_78._initializer.write_fn = (exr_write_func_ptr_t)0x0;
  local_78._initializer.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_78._initializer.max_image_width = 0;
  local_78._initializer.max_image_height = 0;
  local_78._initializer.max_tile_width = 0;
  local_78._initializer.max_tile_height = 0;
  local_78._initializer.zip_level = -2;
  local_78._initializer.dwa_quality = -1.0;
  local_78._initializer.flags = 2;
  local_78._initializer.pad[0] = '\0';
  local_78._initializer.pad[1] = '\0';
  local_78._initializer.pad[2] = '\0';
  local_78._initializer.pad[3] = '\0';
  local_78._ctxt_type = TEMP;
  local_78._108_4_ = 0;
  DeepScanLineInputFile(this,fileName,&local_78,numThreads);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const char fileName[], int numThreads)
    : DeepScanLineInputFile (
        fileName,
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false),
        numThreads)
{
}